

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::hufDecode
               (Int64 *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,unsigned_short *out)

{
  undefined2 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined2 *puVar4;
  int iVar5;
  uint uVar6;
  undefined2 *puVar7;
  undefined8 *puVar8;
  Int64 IVar9;
  Int64 IVar10;
  int in_ECX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined2 *in_stack_00000008;
  unsigned_short s_2;
  uchar cs_2;
  HufDec pl_1;
  int i;
  unsigned_short s_1;
  uchar cs_1;
  int l;
  int j;
  unsigned_short s;
  uchar cs;
  HufDec pl;
  char *ie;
  unsigned_short *oe;
  unsigned_short *outb;
  int lc;
  Int64 c;
  byte local_89;
  int local_88;
  byte local_6d;
  int local_68;
  byte local_61;
  int local_60;
  int local_34;
  ulong local_30;
  byte *local_18;
  
  puVar4 = in_stack_00000008;
  local_30 = 0;
  local_34 = 0;
  puVar7 = in_stack_00000008 + in_R9D;
  local_18 = in_RDX;
  do {
    if (in_RDX + (in_ECX + 7) / 8 <= local_18) {
      uVar6 = 8U - in_ECX & 7;
      local_30 = local_30 >> (sbyte)uVar6;
      local_34 = local_34 - uVar6;
      while (0 < local_34) {
        uVar2 = *(undefined8 *)
                 (in_RSI + (local_30 << (0xeU - (char)local_34 & 0x3f) & 0x3fff) * 0x10);
        local_88 = (int)uVar2;
        if ((char)uVar2 == '\0') {
          invalidCode();
        }
        else {
          local_34 = local_34 - (char)uVar2;
          if (local_88 >> 8 == in_R8D) {
            if (local_34 < 8) {
              local_30 = local_30 << 8 | (ulong)*local_18;
              local_34 = local_34 + 8;
              local_18 = local_18 + 1;
            }
            local_34 = local_34 + -8;
            local_89 = (byte)(local_30 >> ((byte)local_34 & 0x3f));
            if (puVar7 < in_stack_00000008 + (int)(uint)local_89) {
              tooMuchData();
            }
            else if (in_stack_00000008 + -1 < puVar4) {
              notEnoughData();
            }
            uVar1 = in_stack_00000008[-1];
            while (local_89 != 0) {
              *in_stack_00000008 = uVar1;
              in_stack_00000008 = in_stack_00000008 + 1;
              local_89 = local_89 - 1;
            }
          }
          else if (in_stack_00000008 < puVar7) {
            *in_stack_00000008 = (short)((ulong)uVar2 >> 8);
            in_stack_00000008 = in_stack_00000008 + 1;
          }
          else {
            tooMuchData();
          }
        }
      }
      if ((long)in_stack_00000008 - (long)puVar4 >> 1 != (long)in_R9D) {
        notEnoughData();
      }
      return;
    }
    local_30 = local_30 << 8 | (ulong)*local_18;
    local_34 = local_34 + 8;
    local_18 = local_18 + 1;
    while (0xd < local_34) {
      puVar8 = (undefined8 *)(in_RSI + (local_30 >> ((char)local_34 - 0xeU & 0x3f) & 0x3fff) * 0x10)
      ;
      uVar2 = *puVar8;
      lVar3 = puVar8[1];
      local_60 = (int)uVar2;
      local_60 = local_60 >> 8;
      if ((char)uVar2 == '\0') {
        if (lVar3 == 0) {
          invalidCode();
        }
        for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
          IVar9 = hufLength(*(Int64 *)(in_RDI + (long)*(int *)(lVar3 + (long)local_68 * 4) * 8));
          iVar5 = (int)IVar9;
          for (; local_34 < iVar5 && local_18 < in_RDX + (in_ECX + 7) / 8; local_34 = local_34 + 8)
          {
            local_30 = local_30 << 8 | (ulong)*local_18;
            local_18 = local_18 + 1;
          }
          if ((iVar5 <= local_34) &&
             (IVar10 = hufCode(*(Int64 *)(in_RDI + (long)*(int *)(lVar3 + (long)local_68 * 4) * 8)),
             IVar10 == (local_30 >> ((char)local_34 - (byte)IVar9 & 0x3f) &
                       (1L << ((byte)IVar9 & 0x3f)) - 1U))) {
            local_34 = local_34 - iVar5;
            if (*(int *)(lVar3 + (long)local_68 * 4) == in_R8D) {
              if (local_34 < 8) {
                local_30 = local_30 << 8 | (ulong)*local_18;
                local_34 = local_34 + 8;
                local_18 = local_18 + 1;
              }
              local_34 = local_34 + -8;
              local_6d = (byte)(local_30 >> ((byte)local_34 & 0x3f));
              if (puVar7 < in_stack_00000008 + (int)(uint)local_6d) {
                tooMuchData();
              }
              else if (in_stack_00000008 + -1 < puVar4) {
                notEnoughData();
              }
              uVar1 = in_stack_00000008[-1];
              while (local_6d != 0) {
                *in_stack_00000008 = uVar1;
                in_stack_00000008 = in_stack_00000008 + 1;
                local_6d = local_6d - 1;
              }
            }
            else if (in_stack_00000008 < puVar7) {
              *in_stack_00000008 = (short)*(undefined4 *)(lVar3 + (long)local_68 * 4);
              in_stack_00000008 = in_stack_00000008 + 1;
            }
            else {
              tooMuchData();
            }
            break;
          }
        }
        if (local_68 == local_60) {
          invalidCode();
        }
      }
      else {
        local_34 = local_34 - (char)uVar2;
        if (local_60 == in_R8D) {
          if (local_34 < 8) {
            local_30 = local_30 << 8 | (ulong)*local_18;
            local_34 = local_34 + 8;
            local_18 = local_18 + 1;
          }
          local_34 = local_34 + -8;
          local_61 = (byte)(local_30 >> ((byte)local_34 & 0x3f));
          if (puVar7 < in_stack_00000008 + (int)(uint)local_61) {
            tooMuchData();
          }
          else if (in_stack_00000008 + -1 < puVar4) {
            notEnoughData();
          }
          uVar1 = in_stack_00000008[-1];
          while (local_61 != 0) {
            *in_stack_00000008 = uVar1;
            in_stack_00000008 = in_stack_00000008 + 1;
            local_61 = local_61 - 1;
          }
        }
        else if (in_stack_00000008 < puVar7) {
          *in_stack_00000008 = (short)((ulong)uVar2 >> 8);
          in_stack_00000008 = in_stack_00000008 + 1;
        }
        else {
          tooMuchData();
        }
      }
    }
  } while( true );
}

Assistant:

void
hufDecode
    (const Int64 * 	hcode,	// i : encoding table
     const HufDec * 	hdecod,	// i : decoding table
     const char* 	in,	// i : compressed input buffer
     int		ni,	// i : input size (in bits)
     int		rlc,	// i : run-length code
     int		no,	// i : expected output size (in bytes)
     unsigned short*	out)	//  o: uncompressed output buffer
{
    Int64 c = 0;
    int lc = 0;
    unsigned short * outb = out;
    unsigned short * oe = out + no;
    const char * ie = in + (ni + 7) / 8; // input byte size

    //
    // Loop on input bytes
    //

    while (in < ie)
    {
	getChar (c, lc, in);

	//
	// Access decoding table
	//

	while (lc >= HUF_DECBITS)
	{
	    const HufDec pl = hdecod[(c >> (lc-HUF_DECBITS)) & HUF_DECMASK];

	    if (pl.len)
	    {
		//
		// Get short code
		//

		lc -= pl.len;
		getCode (pl.lit, rlc, c, lc, in, out, outb, oe);
	    }
	    else
	    {
		if (!pl.p)
		    invalidCode(); // wrong code

		//
		// Search long code
		//

		int j;

		for (j = 0; j < pl.lit; j++)
		{
		    int	l = hufLength (hcode[pl.p[j]]);

		    while (lc < l && in < ie)	// get more bits
			getChar (c, lc, in);

		    if (lc >= l)
		    {
			if (hufCode (hcode[pl.p[j]]) ==
				((c >> (lc - l)) & ((Int64(1) << l) - 1)))
			{
			    //
			    // Found : get long code
			    //

			    lc -= l;
			    getCode (pl.p[j], rlc, c, lc, in, out, outb, oe);
			    break;
			}
		    }
		}

		if (j == pl.lit)
		    invalidCode(); // Not found
	    }
	}
    }

    //
    // Get remaining (short) codes
    //

    int i = (8 - ni) & 7;
    c >>= i;
    lc -= i;

    while (lc > 0)
    {
	const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

	if (pl.len)
	{
	    lc -= pl.len;
	    getCode (pl.lit, rlc, c, lc, in, out, outb, oe);
	}
	else
	{
	    invalidCode(); // wrong (long) code
	}
    }

    if (out - outb != no)
	notEnoughData ();
}